

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<unsigned_int,_unsigned_long,_0>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uint *t,unsigned_long *u,uint *result)

{
  uint uVar1;
  
  if (*u != 0) {
    if ((ulong)*t == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (uint)((ulong)*t / *u);
    }
    *result = uVar1;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        result = (T)( t/u );
    }